

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O1

ssize_t __thiscall
BuildsMetaMakefileGenerator::write
          (BuildsMetaMakefileGenerator *this,int __fd,void *__buf,size_t __n)

{
  QList<BuildsMetaMakefileGenerator::Build_*> *this_00;
  QString *pQVar1;
  Build *dst;
  QMakeProject *this_01;
  Data *pDVar2;
  char16_t *pcVar3;
  FILE *__stream;
  Data *pDVar4;
  qsizetype qVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  iterator iVar9;
  MakefileGenerator *pMVar10;
  pointer ppBVar11;
  size_t __n_00;
  byte bVar12;
  undefined7 uVar13;
  void *__buf_00;
  ulong uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  QByteArrayView QVar16;
  uint local_118;
  Build *local_110;
  QArrayData *local_f8 [3];
  undefined1 local_e0 [72];
  ProString local_98;
  QString local_68;
  QArrayData *local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->makefiles;
  if ((this->makefiles).d.size == 0) {
    local_110 = (Build *)0x0;
  }
  else {
    iVar9 = QList<BuildsMetaMakefileGenerator::Build_*>::begin(this_00);
    local_110 = (Build *)0x0;
    if ((((*iVar9.i)->build).d.ptr != (char16_t *)0x0) && (Option::qmake_mode != QMAKE_GENERATE_PRL)
       ) {
      local_110 = (Build *)operator_new(0x38);
      (local_110->name).d.d = (Data *)0x0;
      (local_110->name).d.ptr = (char16_t *)0x0;
      (local_110->name).d.size = 0;
      (local_110->build).d.d = (Data *)0x0;
      (local_110->build).d.ptr = (char16_t *)0x0;
      (local_110->build).d.size = 0;
      QString::operator=((QString *)local_110,(QString *)&(this->super_MetaMakefileGenerator).name);
      pMVar10 = MetaMakefileGenerator::createMakefileGenerator
                          ((this->super_MetaMakefileGenerator).project,true);
      local_110->makefile = pMVar10;
      local_98.m_string.d.d = (Data *)local_110;
      QtPrivate::QPodArrayOps<BuildsMetaMakefileGenerator::Build*>::
      emplace<BuildsMetaMakefileGenerator::Build*&>
                ((QPodArrayOps<BuildsMetaMakefileGenerator::Build*> *)this_00,
                 (this->makefiles).d.size,(Build **)(local_e0 + 0x48));
      QList<BuildsMetaMakefileGenerator::Build_*>::end(this_00);
    }
  }
  QFile::fileName();
  uVar14 = 0;
  local_118 = 1;
  do {
    if ((ulong)(this->makefiles).d.size <= uVar14) break;
    QFile::setFileName((QString *)Option::output);
    ppBVar11 = QList<BuildsMetaMakefileGenerator::Build_*>::data(this_00);
    dst = ppBVar11[uVar14];
    bVar7 = true;
    if ((dst->makefile == (MakefileGenerator *)0x0) ||
       (1 < Option::qmake_mode - QMAKE_GENERATE_PROJECT)) {
LAB_0019a31b:
      if (dst->makefile == (MakefileGenerator *)0x0) {
        local_118 = 0;
      }
      else if (dst == local_110) {
        checkForConflictingTargets(this);
        ProKey::ProKey((ProKey *)(local_e0 + 0x48),"QMAKE_INTERNAL_INCLUDED_FILES");
        accumulateVariableFromBuilds(this,(ProKey *)(local_e0 + 0x48),dst);
        if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_118 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1b])();
      }
      else {
        local_118 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1a])();
        if ((local_110 != (Build *)0x0) &&
           (iVar8 = (*(local_110->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo
                      [0x1d])(), (char)iVar8 != '\0')) {
          local_118 = (*(local_110->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo
                        [0x1e])(local_110->makefile,dst->makefile);
        }
      }
      bVar15 = true;
      if (!bVar7) {
        QFileDevice::close();
        if ((byte)local_118 == '\0') {
          QFile::remove();
        }
      }
    }
    else {
      iVar8 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1d])();
      if ((char)iVar8 != '\0') {
        iVar8 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1d])();
        if ((char)iVar8 == '\0') {
          bVar7 = true;
        }
        else {
          bVar7 = true;
          if (local_110 == (Build *)0x0 || dst == local_110) goto LAB_00199fa5;
        }
        goto LAB_0019a31b;
      }
LAB_00199fa5:
      cVar6 = QIODevice::isOpen();
      if (cVar6 != '\0') {
LAB_00199fb8:
        bVar7 = false;
        goto LAB_0019a31b;
      }
      QFile::fileName();
      bVar7 = comparesEqual((QString *)(local_e0 + 0x48),"-");
      if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (bVar7) {
        QVar16.m_data = (storage_type *)0x0;
        QVar16.m_size = (qsizetype)(local_e0 + 0x48);
        QString::fromUtf8(QVar16);
        local_e0._24_8_ = local_98.m_string.d.d;
        local_e0._32_8_ = local_98.m_string.d.ptr;
        local_e0._40_8_ = local_98.m_string.d.size;
        QFile::setFileName((QString *)Option::output);
        if ((Build *)local_e0._24_8_ != (Build *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_e0._24_8_)->d).d =
               *(int *)&(((QString *)local_e0._24_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_e0._24_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_e0._24_8_,2,0x10);
          }
        }
        qmake_getpwd();
        qVar5 = local_98.m_string.d.size;
        pDVar4 = local_98.m_string.d.d;
        pcVar3 = Option::output_dir.d.ptr;
        pDVar2 = Option::output_dir.d.d;
        local_98.m_string.d.d = Option::output_dir.d.d;
        Option::output_dir.d.d = pDVar4;
        Option::output_dir.d.ptr = local_98.m_string.d.ptr;
        local_98.m_string.d.ptr = pcVar3;
        local_98.m_string.d.size = Option::output_dir.d.size;
        Option::output_dir.d.size = qVar5;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
          }
        }
        iVar8 = 0x2e2c98;
        __buf_00 = _stdout;
        cVar6 = QFile::open(Option::output,_stdout,0x12,0);
        bVar7 = true;
        if (cVar6 != '\0') goto LAB_0019a31b;
        write(iVar8,__buf_00,__n_00);
        bVar15 = false;
      }
      else {
        QFile::fileName();
        bVar7 = local_98.m_string.d.size == 0;
        bVar15 = Option::qmake_mode == QMAKE_GENERATE_MAKEFILE;
        if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar7 && bVar15) {
          this_01 = (this->super_MetaMakefileGenerator).project;
          ProKey::ProKey((ProKey *)(local_e0 + 0x18),"QMAKE_MAKEFILE");
          QMakeEvaluator::first
                    ((ProString *)(local_e0 + 0x48),&this_01->super_QMakeEvaluator,
                     (ProKey *)(local_e0 + 0x18));
          ProString::toQString(&local_68,(ProString *)(local_e0 + 0x48));
          QFile::setFileName((QString *)Option::output);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((Build *)local_e0._24_8_ != (Build *)0x0) {
            LOCK();
            *(int *)&(((QString *)local_e0._24_8_)->d).d =
                 *(int *)&(((QString *)local_e0._24_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_e0._24_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_e0._24_8_,2,0x10);
            }
          }
        }
        local_98.m_string.d.d = (dst->name).d.d;
        local_98.m_string.d.ptr = (dst->name).d.ptr;
        local_98.m_string.d.size = (dst->name).d.size;
        if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
          LOCK();
          *(int *)&(((Build *)local_98.m_string.d.d)->name).d.d =
               *(int *)&(((Build *)local_98.m_string.d.d)->name).d.d + 1;
          UNLOCK();
        }
        pQVar1 = (QString *)(local_e0 + 0x48);
        if ((dst->build).d.size != 0) {
          if (local_98.m_string.d.size != 0) {
            QString::append(pQVar1,".",1);
          }
          QString::append(pQVar1);
        }
        iVar8 = (*(dst->makefile->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x1f])
                          (dst->makefile,Option::output,pQVar1);
        __stream = _stderr;
        if ((char)iVar8 != '\0') {
          if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          goto LAB_00199fb8;
        }
        QFile::fileName();
        if (local_e0._40_8_ == 0) {
          fprintf(__stream,"Failure to open file: %s\n","(stdout)");
        }
        else {
          write((BuildsMetaMakefileGenerator *)local_e0,(int)local_f8,local_e0 + 8,(size_t)__stream)
          ;
          if (local_f8[0] != (QArrayData *)0x0) {
            LOCK();
            (local_f8[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_f8[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_f8[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_f8[0],2,0x10);
            }
          }
        }
        if ((Build *)local_e0._24_8_ != (Build *)0x0) {
          LOCK();
          *(int *)&(((QString *)local_e0._24_8_)->d).d =
               *(int *)&(((QString *)local_e0._24_8_)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_e0._24_8_)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_e0._24_8_,2,0x10);
          }
        }
        if ((Build *)local_98.m_string.d.d != (Build *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_98.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        bVar15 = false;
      }
    }
    if (!bVar15) {
      bVar12 = 0;
      uVar13 = 0;
      goto LAB_0019a518;
    }
    uVar14 = uVar14 + 1;
  } while ((local_118 & 1) != 0);
  bVar12 = 1;
  uVar13 = 0x2e2c;
LAB_0019a518:
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return CONCAT71(uVar13,bVar12 & (byte)local_118);
}

Assistant:

bool
BuildsMetaMakefileGenerator::write()
{
    Build *glue = nullptr;
    if(!makefiles.isEmpty() && !makefiles.first()->build.isNull()
        && Option::qmake_mode != Option::QMAKE_GENERATE_PRL) {
        glue = new Build;
        glue->name = name;
        glue->makefile = createMakefileGenerator(project, true);
        makefiles += glue;
    }

    bool ret = true;
    const QString &output_name = Option::output.fileName();
    for(int i = 0; ret && i < makefiles.size(); i++) {
        Option::output.setFileName(output_name);
        Build *build = makefiles[i];

        bool using_stdout = false;
        if(build->makefile && (Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                               Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
           && (!build->makefile->supportsMergedBuilds()
            || (build->makefile->supportsMergedBuilds() && (!glue || build == glue)))) {
            //open output
            if(!(Option::output.isOpen())) {
                if(Option::output.fileName() == "-") {
                    Option::output.setFileName("");
                    Option::output_dir = qmake_getpwd();
                    if (!Option::output.open(stdout, QIODevice::WriteOnly | QIODevice::Text)) {
                        fprintf(stderr, "Failure to open stdout\n");
                        return false;
                    }
                    using_stdout = true;
                } else {
                    if(Option::output.fileName().isEmpty() &&
                       Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE)
                        Option::output.setFileName(project->first("QMAKE_MAKEFILE").toQString());
                    QString build_name = build->name;
                    if(!build->build.isEmpty()) {
                        if(!build_name.isEmpty())
                            build_name += ".";
                        build_name += build->build;
                    }
                    if(!build->makefile->openOutput(Option::output, build_name)) {
                        fprintf(stderr, "Failure to open file: %s\n",
                                Option::output.fileName().isEmpty() ? "(stdout)" :
                                Option::output.fileName().toLatin1().constData());
                        return false;
                    }
                }
            }
        } else {
           using_stdout = true; //kind of..
        }

        if(!build->makefile) {
            ret = false;
        } else if(build == glue) {
            checkForConflictingTargets();
            accumulateVariableFromBuilds("QMAKE_INTERNAL_INCLUDED_FILES", build);
            ret = build->makefile->writeProjectMakefile();
        } else {
            ret = build->makefile->write();
            if (glue && glue->makefile->supportsMergedBuilds())
                ret = glue->makefile->mergeBuildProject(build->makefile);
        }
        if(!using_stdout) {
            Option::output.close();
            if(!ret)
                Option::output.remove();
        }
    }
    return ret;
}